

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigProve(Ivy_Man_t **ppManAig,void *pPars)

{
  int iVar1;
  sat_solver *psVar2;
  double dVar3;
  double dVar4;
  ABC_INT64_T AVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Ivy_Man_t *pMan;
  Ivy_Man_t *pIVar9;
  abctime aVar10;
  Ivy_FraigMan_t *p;
  abctime aVar11;
  long lVar12;
  void *__s;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  size_t __size;
  ABC_INT64_T AVar16;
  double dVar17;
  ABC_INT64_T local_90;
  Ivy_FraigParams_t local_78;
  
  pIVar9 = *ppManAig;
  local_78._60_4_ = 0;
  local_78.nSimWords = 0x20;
  local_78._4_4_ = 0;
  local_78.dSimSatur = 0.005;
  local_78.fPatScores = 0;
  local_78.MaxScore = 0x19;
  local_78.fDoSparse = 1;
  local_78.dActConeRatio = 0.3;
  local_78.dActConeBumpMax = 10.0;
  local_78.nBTLimitNode = 100;
  local_78.nBTLimitMiter = 500000;
  local_78.fVerbose = *(int *)((long)pPars + 0xc);
  local_78.fProve = 1;
  if (*(int *)((long)pPars + 0xc) != 0) {
    pcVar13 = "yes";
    pcVar15 = "yes";
    if (*(int *)((long)pPars + 4) == 0) {
      pcVar15 = "no";
    }
    if (*pPars == 0) {
      pcVar13 = "no";
    }
    printf("RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
           (ulong)*(uint *)((long)pPars + 0x10),pcVar15,pcVar13);
    printf("Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n",
           SUB84((double)*(float *)((long)pPars + 0x18),0),(double)*(float *)((long)pPars + 0x20),
           (double)*(float *)((long)pPars + 0x28),(ulong)*(uint *)((long)pPars + 0x14),
           (ulong)*(uint *)((long)pPars + 0x1c),(ulong)*(uint *)((long)pPars + 0x24),
           (ulong)*(uint *)((long)pPars + 0x34));
  }
  if ((*(int *)((long)pPars + 4) == 0) && (*pPars == 0)) {
    aVar8 = Abc_Clock();
    local_78.nBTLimitMiter = *(int *)((long)pPars + 0x34) / pIVar9->nObjs[2];
    pMan = Ivy_FraigMiter(pIVar9,&local_78);
    Ivy_ManStop(pIVar9);
    iVar6 = Ivy_FraigMiterStatus(pMan);
    Ivy_FraigMiterPrint(pMan,"SAT solving",aVar8,*(int *)((long)pPars + 0xc));
  }
  else {
    pMan = pIVar9;
    if (pIVar9->nObjs[6] + pIVar9->nObjs[5] < 500) {
      aVar8 = Abc_Clock();
      local_78.nBTLimitMiter = *(int *)((long)pPars + 0x14) / pIVar9->nObjs[2];
      pMan = Ivy_FraigMiter(pIVar9,&local_78);
      Ivy_ManStop(pIVar9);
      iVar6 = Ivy_FraigMiterStatus(pMan);
      Ivy_FraigMiterPrint(pMan,"SAT solving",aVar8,*(int *)((long)pPars + 0xc));
      if (-1 < iVar6) goto LAB_00650f52;
    }
    AVar16 = 0;
    local_90 = 0;
    iVar6 = 0;
    do {
      pIVar9 = pMan;
      if (*(int *)((long)pPars + 0x10) <= iVar6) goto LAB_00650ee4;
      dVar17 = (double)iVar6;
      if (*(int *)((long)pPars + 0xc) != 0) {
        iVar7 = *(int *)((long)pPars + 0x14);
        dVar3 = pow((double)*(float *)((long)pPars + 0x18),dVar17);
        iVar1 = *(int *)((long)pPars + 0x24);
        dVar4 = pow((double)*(float *)((long)pPars + 0x28),dVar17);
        printf("ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n",(ulong)(iVar6 + 1),
               (ulong)(uint)(int)(dVar3 * (double)iVar7),(ulong)(uint)(int)(dVar4 * (double)iVar1));
        fflush(_stdout);
      }
      iVar7 = Ivy_FraigMiterStatus(pMan);
      if (-1 < iVar7) {
LAB_00650f45:
        if (iVar7 == 0) {
          iVar6 = 0;
          if (pMan->pData == (void *)0x0) {
            __size = (long)pMan->nObjs[1] << 2;
            __s = malloc(__size);
            pMan->pData = __s;
            memset(__s,0,__size);
            iVar6 = 0;
          }
        }
        else {
          iVar6 = 1;
        }
        goto LAB_00650f52;
      }
      if (*pPars != 0) {
        aVar8 = Abc_Clock();
        iVar7 = *(int *)((long)pPars + 0x24);
        dVar3 = pow((double)*(float *)((long)pPars + 0x28),dVar17);
        local_78.nBTLimitNode = (int)(dVar3 * (double)iVar7);
        iVar7 = *(int *)((long)pPars + 0x14);
        dVar17 = pow((double)*(float *)((long)pPars + 0x18),dVar17);
        local_78.nBTLimitMiter = (int)(dVar17 * (double)iVar7) / pMan->nObjs[2] + 1;
        if (pMan->nObjs[6] + pMan->nObjs[5] == 0) {
          pIVar9 = Ivy_ManDup(pMan);
        }
        else {
          AVar16 = *(ABC_INT64_T *)((long)pPars + 0x38);
          AVar5 = *(ABC_INT64_T *)((long)pPars + 0x40);
          aVar10 = Abc_Clock();
          if (pMan->nObjs[4] != 0) {
            __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                          ,0x1a6,
                          "Ivy_Man_t *Ivy_FraigPerform_int(Ivy_Man_t *, Ivy_FraigParams_t *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T *, ABC_INT64_T *)"
                         );
          }
          p = Ivy_FraigStart(pMan,&local_78);
          p->nBTLimitGlobal = AVar16;
          p->nInsLimitGlobal = AVar5;
          Ivy_FraigSimulate(p);
          Ivy_FraigSweep(p);
          pIVar9 = p->pManFraig;
          aVar11 = Abc_Clock();
          p->timeTotal = aVar11 - aVar10;
          psVar2 = p->pSat;
          if (psVar2 == (sat_solver *)0x0) {
            AVar16 = 0;
            local_90 = 0;
          }
          else {
            local_90 = (psVar2->stats).inspects;
            AVar16 = (psVar2->stats).conflicts;
          }
          Ivy_FraigStop(p);
        }
        Ivy_ManStop(pMan);
        iVar7 = Ivy_FraigMiterStatus(pIVar9);
        Ivy_FraigMiterPrint(pIVar9,"Fraiging   ",aVar8,*(int *)((long)pPars + 0xc));
        pMan = pIVar9;
        if (-1 < iVar7) goto LAB_00650f45;
      }
      lVar14 = *(long *)((long)pPars + 0x48) + AVar16;
      *(long *)((long)pPars + 0x48) = lVar14;
      lVar12 = *(long *)((long)pPars + 0x50) + local_90;
      *(long *)((long)pPars + 0x50) = lVar12;
      if ((*(long *)((long)pPars + 0x38) != 0) && (*(long *)((long)pPars + 0x38) <= lVar14)) break;
      iVar6 = iVar6 + 1;
      pMan = pIVar9;
    } while ((*(long *)((long)pPars + 0x40) == 0) || (lVar12 < *(long *)((long)pPars + 0x40)));
    puts("Reached global limit on conflicts/inspects. Quitting.");
LAB_00650ee4:
    iVar6 = -1;
    pMan = pIVar9;
  }
LAB_00650f52:
  *ppManAig = pMan;
  return iVar6;
}

Assistant:

int Ivy_FraigProve( Ivy_Man_t ** ppManAig, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Ivy_FraigParams_t Params, * pIvyParams = &Params; 
    Ivy_Man_t * pManAig, * pManTemp;
    int RetValue, nIter;
    abctime clk;//, Counter;
    ABC_INT64_T nSatConfs = 0, nSatInspects = 0;

    // start the network and parameters
    pManAig = *ppManAig;
    Ivy_FraigParamsDefault( pIvyParams );
    pIvyParams->fVerbose = pParams->fVerbose;
    pIvyParams->fProve = 1;

    if ( pParams->fVerbose )
    {
        printf( "RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
            pParams->nItersMax, pParams->fUseRewriting? "yes":"no", pParams->fUseFraiging? "yes":"no" );
        printf( "Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n", 
            pParams->nMiteringLimitStart,  pParams->nMiteringLimitMulti, 
            pParams->nRewritingLimitStart, pParams->nRewritingLimitMulti,
            pParams->nFraigingLimitStart,  pParams->nFraigingLimitMulti, pParams->nMiteringLimitLast );
    }

    // if SAT only, solve without iteration
    if ( !pParams->fUseRewriting && !pParams->fUseFraiging )
    {
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitLast / Ivy_ManPoNum(pManAig);
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        *ppManAig = pManAig;
        return RetValue;
    }

    if ( Ivy_ManNodeNum(pManAig) < 500 )
    {
        // run the first mitering
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitStart / Ivy_ManPoNum(pManAig);
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        if ( RetValue >= 0 )
        {
            *ppManAig = pManAig;
            return RetValue;
        }
    }

    // check the current resource limits
    RetValue = -1;
    for ( nIter = 0; nIter < pParams->nItersMax; nIter++ )
    {
        if ( pParams->fVerbose )
        {
            printf( "ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n", nIter+1, 
                 (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), 
                 (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)) );
            fflush( stdout );
        }

        // try rewriting
        if ( pParams->fUseRewriting )
        { // bug in Ivy_NodeFindCutsAll() when leaves are identical!
/*
            clk = Abc_Clock();
            Counter = (int)(pParams->nRewritingLimitStart * pow(pParams->nRewritingLimitMulti,nIter));
            pManAig = Ivy_ManRwsat( pManAig, 0 );  
            RetValue = Ivy_FraigMiterStatus( pManAig );
            Ivy_FraigMiterPrint( pManAig, "Rewriting  ", clk, pParams->fVerbose );
*/
        }
        if ( RetValue >= 0 )
            break;

        // catch the situation when ref pattern detects the bug
        RetValue = Ivy_FraigMiterStatus( pManAig );
        if ( RetValue >= 0 )
            break;

        // try fraiging followed by mitering
        if ( pParams->fUseFraiging )
        {
            clk = Abc_Clock();
            pIvyParams->nBTLimitNode  = (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter));
            pIvyParams->nBTLimitMiter = 1 + (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)) / Ivy_ManPoNum(pManAig);
            pManAig = Ivy_FraigPerform_int( pManTemp = pManAig, pIvyParams, pParams->nTotalBacktrackLimit, pParams->nTotalInspectLimit, &nSatConfs, &nSatInspects );  Ivy_ManStop( pManTemp );
            RetValue = Ivy_FraigMiterStatus( pManAig );
            Ivy_FraigMiterPrint( pManAig, "Fraiging   ", clk, pParams->fVerbose );
        }
        if ( RetValue >= 0 )
            break;

        // add to the number of backtracks and inspects
        pParams->nTotalBacktracksMade += nSatConfs;
        pParams->nTotalInspectsMade   += nSatInspects;
        // check if global resource limit is reached
        if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
             (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
        {
            printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
            *ppManAig = pManAig;
            return -1;
        }
    }    
/*
    if ( RetValue < 0 )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting SAT with conflict limit %d ...\n", pParams->nMiteringLimitLast );
            fflush( stdout );
        }
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitLast / Ivy_ManPoNum(pManAig);
        if ( pParams->nTotalBacktrackLimit )
            s_nBTLimitGlobal  = pParams->nTotalBacktrackLimit - pParams->nTotalBacktracksMade;
        if ( pParams->nTotalInspectLimit )
            s_nInsLimitGlobal = pParams->nTotalInspectLimit -   pParams->nTotalInspectsMade;        
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        s_nBTLimitGlobal  = 0;
        s_nInsLimitGlobal = 0;        
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        // make sure that the sover never returns "undecided" when infinite resource limits are set
        if( RetValue == -1 && pParams->nTotalInspectLimit == 0 &&
            pParams->nTotalBacktrackLimit == 0 )
        {
            extern void Prove_ParamsPrint( Prove_Params_t * pParams );
            Prove_ParamsPrint( pParams );
            printf("ERROR: ABC has returned \"undecided\" in spite of no limits...\n");
            exit(1);
        }
    }
*/
    // assign the model if it was proved by rewriting (const 1 miter)
    if ( RetValue == 0 && pManAig->pData == NULL )
    {
        pManAig->pData = ABC_ALLOC( int, Ivy_ManPiNum(pManAig) );
        memset( pManAig->pData, 0, sizeof(int) * Ivy_ManPiNum(pManAig) );
    }
    *ppManAig = pManAig;
    return RetValue;
}